

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

DNA * __thiscall Population::GetDNAWithProbability(Population *this,double probability)

{
  DNA *dna;
  DNA *pDVar1;
  double dVar2;
  
  pDVar1 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = 0.0;
  while( true ) {
    if (pDVar1 == (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocheretnyi[P]genetic_diophantine/Population.cpp"
                    ,0x5d,"const DNA &Population::GetDNAWithProbability(double) const");
    }
    dVar2 = dVar2 + pDVar1->likelihood;
    if (probability < dVar2) break;
    pDVar1 = pDVar1 + 1;
  }
  return pDVar1;
}

Assistant:

const DNA& Population::GetDNAWithProbability(double probability) const {
    double sum = 0.0f;
    for (const DNA& dna : population_) {
        sum += dna.likelihood;
        if (probability < sum) {
            return dna;
        }
    }
    assert(false);
    return DNA();
}